

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

Array2D<double> * __thiscall
pbrt::SummedAreaTable::integrate
          (Array2D<double> *__return_storage_ptr__,SummedAreaTable *this,Array2D<float> *values,
          Allocator alloc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  double *pdVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  float fVar21;
  
  Array2D<double>::Array2D
            (__return_storage_ptr__,
             (values->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x -
             (values->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x,
             (values->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y -
             (values->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y,
             (allocator_type)alloc.memoryResource);
  iVar13 = (values->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
  iVar1 = (values->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
  pfVar4 = values->values;
  iVar2 = (__return_storage_ptr__->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
  iVar3 = (__return_storage_ptr__->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
  iVar9 = (values->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar13;
  iVar11 = iVar9 * iVar1 + iVar13;
  fVar21 = (float)(((values->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y - iVar1) * iVar9);
  pdVar5 = __return_storage_ptr__->values;
  uVar6 = (__return_storage_ptr__->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar2;
  iVar7 = uVar6 * iVar3 + iVar2;
  iVar16 = -iVar7;
  pdVar5[iVar16] = (double)(pfVar4[-iVar11] / fVar21);
  if (1 < (int)uVar6) {
    iVar15 = -iVar7;
    lVar20 = (ulong)uVar6 - 1;
    iVar11 = -iVar11;
    do {
      iVar11 = iVar11 + 1;
      lVar12 = (long)iVar15;
      iVar15 = iVar15 + 1;
      lVar20 = lVar20 + -1;
      pdVar5[iVar15] = (double)(pfVar4[iVar11] / fVar21) + pdVar5[lVar12];
    } while (lVar20 != 0);
  }
  uVar10 = (__return_storage_ptr__->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y - iVar3;
  if (1 < (int)uVar10) {
    iVar11 = (1 - iVar1) * iVar9 - iVar13;
    iVar15 = (1 - iVar3) * uVar6 - iVar2;
    lVar20 = (ulong)uVar10 - 1;
    do {
      lVar12 = (long)iVar11;
      lVar17 = (long)iVar16;
      iVar11 = iVar11 + iVar9;
      iVar16 = iVar16 + uVar6;
      pdVar5[iVar15] = (double)(pfVar4[lVar12] / fVar21) + pdVar5[lVar17];
      iVar15 = iVar15 + uVar6;
      lVar20 = lVar20 + -1;
    } while (lVar20 != 0);
    if (1 < (int)uVar10) {
      uVar18 = (ulong)uVar6;
      uVar19 = 1;
      uVar8 = (ulong)(uint)-iVar7;
      uVar14 = (ulong)((1 - iVar3) * uVar6 - iVar2);
      iVar13 = ((1 - iVar1) * iVar9 - iVar13) + 1;
      do {
        if (1 < (int)uVar6) {
          lVar20 = 0;
          do {
            iVar1 = (int)lVar20;
            iVar2 = (int)uVar8 + iVar1;
            lVar20 = lVar20 + 1;
            pdVar5[(int)uVar14 + 1 + iVar1] =
                 ((double)(pfVar4[iVar13 + iVar1] / fVar21) + pdVar5[(int)uVar14 + iVar1] +
                 pdVar5[iVar2 + 1]) - pdVar5[iVar2];
          } while (uVar18 - 1 != lVar20);
        }
        uVar19 = uVar19 + 1;
        uVar14 = uVar14 + uVar18;
        uVar8 = uVar8 + uVar18;
        iVar13 = iVar13 + iVar9;
      } while (uVar19 != uVar10);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Array2D<double> integrate(const Array2D<Float> &values, Allocator alloc) {
        auto f = [&values](int x, int y) {
            return values(x, y) / (values.xSize() * values.ySize());
        };
        Array2D<double> result(values.xSize(), values.ySize(), alloc);
        result(0, 0) = f(0, 0);
        // Compute sums along first scanline and column
        for (int x = 1; x < result.xSize(); ++x)
            result(x, 0) = f(x, 0) + result(x - 1, 0);
        for (int y = 1; y < result.ySize(); ++y)
            result(0, y) = f(0, y) + result(0, y - 1);

        // Compute sums for the remainder of the entries
        for (int y = 1; y < result.ySize(); ++y)
            for (int x = 1; x < result.xSize(); ++x)
                result(x, y) = (f(x, y) + result(x - 1, y) + result(x, y - 1) -
                                result(x - 1, y - 1));

        return result;
    }